

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

Panel * __thiscall Panel::writeXml_abi_cxx11_(Panel *this,int indent)

{
  uint uVar1;
  ostream *poVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_240 [39];
  allocator local_219;
  string local_218 [32];
  Color local_1f8 [3];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  Panel *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar2,"<Panel");
  std::__cxx11::string::~string((string *)local_1c8);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar2 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"BackgroundColor",&local_219);
  Color::writeXml(local_1f8,indent + 0xa8,(string *)(ulong)uVar1);
  std::operator<<(local_198,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  Widget::writeXmlChildren(this_00,(stringstream *)local_1a8,local_1c + 1);
  Util::getIndent_abi_cxx11_(local_240,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_240);
  std::operator<<(poVar2,"</Panel>");
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string Panel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<Panel";
	writeXmlAttributes(str);

	str << ">" << std::endl;
	str << backgroundColor.writeXml(indent + 1, "BackgroundColor");
	
	writeXmlChildren(str, indent + 1);
	
	str << Util::getIndent(indent) << "</Panel>";
	return str.str();
}